

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::getBoundViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  bool bVar1;
  double *pdVar2;
  double *in_RDX;
  double *in_RSI;
  SoPlexBase<double> *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  double viol;
  double upper;
  double lower;
  int i;
  VectorBase<double> *primal;
  SPxLPBase<double> *in_stack_ffffffffffffffb8;
  int local_2c;
  bool local_1;
  
  bVar1 = isPrimalFeasible(in_RDI);
  if (bVar1) {
    _syncRealSolution(in_RDI);
    *in_RSI = 0.0;
    *in_RDX = 0.0;
    local_2c = numCols((SoPlexBase<double> *)0x42431a);
    while (local_2c = local_2c + -1, -1 < local_2c) {
      dVar3 = SPxLPBase<double>::lowerUnscaled
                        (in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
      dVar4 = SPxLPBase<double>::upperUnscaled
                        (in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_RDI,(int)((ulong)dVar3 >> 0x20));
      dVar5 = dVar3 - *pdVar2;
      if ((0.0 < dVar5) && (*in_RDX = dVar5 + *in_RDX, *in_RSI <= dVar5 && dVar5 != *in_RSI)) {
        *in_RSI = dVar5;
      }
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_RDI,(int)((ulong)dVar3 >> 0x20));
      in_stack_ffffffffffffffb8 = (SPxLPBase<double> *)(*pdVar2 - dVar4);
      if ((0.0 < (double)in_stack_ffffffffffffffb8) &&
         (*in_RDX = (double)in_stack_ffffffffffffffb8 + *in_RDX,
         *in_RSI <= (double)in_stack_ffffffffffffffb8 &&
         (double)in_stack_ffffffffffffffb8 != *in_RSI)) {
        *in_RSI = (double)in_stack_ffffffffffffffb8;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::getBoundViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numCols() - 1; i >= 0; i--)
   {
      R lower = _realLP->lowerUnscaled(i);
      R upper = _realLP->upperUnscaled(i);
      R viol = lower - primal[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = primal[i] - upper;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}